

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMakeAssociationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_24_3_0437a534 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.analyzedAssociationNode = (sysbvm_astMakeAssociationNode_t *)0x0;
  gcFrame.analyzedKey = 0;
  gcFrame.analyzedValue = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 3;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.analyzedAssociationNode =
       (sysbvm_astMakeAssociationNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.analyzedAssociationNode)->super).analyzerToken = sVar1;
  gcFrame.analyzedKey =
       sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                 (context,(gcFrame.analyzedAssociationNode)->key,arguments[1]);
  (gcFrame.analyzedAssociationNode)->key = gcFrame.analyzedKey;
  if ((gcFrame.analyzedAssociationNode)->value != 0) {
    gcFrame.analyzedValue =
         sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                   (context,(gcFrame.analyzedAssociationNode)->value,arguments[1]);
    (gcFrame.analyzedAssociationNode)->value = gcFrame.analyzedValue;
  }
  ((gcFrame.analyzedAssociationNode)->super).analyzedType = (context->roots).associationType;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return (sysbvm_tuple_t)gcFrame.analyzedAssociationNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeAssociationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeAssociationNode_t **associationNode = (sysbvm_astMakeAssociationNode_t**)node;

    struct {
        sysbvm_astMakeAssociationNode_t *analyzedAssociationNode;
        sysbvm_tuple_t analyzedKey;
        sysbvm_tuple_t analyzedValue;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*associationNode)->super.sourcePosition);

    gcFrame.analyzedAssociationNode = (sysbvm_astMakeAssociationNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedAssociationNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedKey = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedAssociationNode->key, *environment);
    gcFrame.analyzedAssociationNode->key = gcFrame.analyzedKey;
    if(gcFrame.analyzedAssociationNode->value)
    {
        gcFrame.analyzedValue = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.analyzedAssociationNode->value, *environment);
        gcFrame.analyzedAssociationNode->value = gcFrame.analyzedValue;
    }

    gcFrame.analyzedAssociationNode->super.analyzedType = context->roots.associationType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedAssociationNode;
}